

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedBase85TTF
          (ImFontAtlas *this,char *compressed_ttf_data_base85,float size_pixels,
          ImFontConfig *font_cfg,ImWchar *glyph_ranges)

{
  int iVar1;
  size_t sVar2;
  int *compressed_ttf_data;
  int *piVar3;
  ImFont *pIVar4;
  char cVar5;
  int extraout_EDX;
  char *pcVar6;
  
  sVar2 = strlen(compressed_ttf_data_base85);
  iVar1 = (int)sVar2 + 4;
  compressed_ttf_data =
       (int *)ImGui::MemAlloc((long)(int)(((uint)((ulong)((long)iVar1 * 0x66666667) >> 0x21) -
                                          (iVar1 >> 0x1f)) * 4));
  cVar5 = *compressed_ttf_data_base85;
  iVar1 = extraout_EDX;
  if (cVar5 != '\0') {
    pcVar6 = compressed_ttf_data_base85 + 5;
    piVar3 = compressed_ttf_data;
    do {
      iVar1 = (((((0x5b < pcVar6[-1] ^ 0xffffffdd) + (int)pcVar6[-1]) * 0x55 +
                (0x5b < pcVar6[-2] ^ 0xffffffdd) + (int)pcVar6[-2]) * 0x55 +
               (0x5b < pcVar6[-3] ^ 0xffffffdd) + (int)pcVar6[-3]) * 0x55 +
              (0x5b < pcVar6[-4] ^ 0xffffffdd) + (int)pcVar6[-4]) * 0x55 +
              ('[' < cVar5 ^ 0xffffffdd) + (int)cVar5;
      *piVar3 = iVar1;
      piVar3 = piVar3 + 1;
      cVar5 = *pcVar6;
      pcVar6 = pcVar6 + 5;
    } while (cVar5 != '\0');
  }
  pIVar4 = AddFontFromMemoryCompressedTTF
                     (this,compressed_ttf_data,iVar1,size_pixels,font_cfg,glyph_ranges);
  ImGui::MemFree(compressed_ttf_data);
  return pIVar4;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedBase85TTF(const char* compressed_ttf_data_base85, float size_pixels, const ImFontConfig* font_cfg, const ImWchar* glyph_ranges)
{
    int compressed_ttf_size = (((int)strlen(compressed_ttf_data_base85) + 4) / 5) * 4;
    void* compressed_ttf = ImGui::MemAlloc((size_t)compressed_ttf_size);
    Decode85((const unsigned char*)compressed_ttf_data_base85, (unsigned char*)compressed_ttf);
    ImFont* font = AddFontFromMemoryCompressedTTF(compressed_ttf, compressed_ttf_size, size_pixels, font_cfg, glyph_ranges);
    ImGui::MemFree(compressed_ttf);
    return font;
}